

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalSetEvent(CPalThread *pthr,HANDLE hEvent,BOOL fSetEvent)

{
  uint uVar1;
  char *__format;
  long *local_38;
  IPalObject *pobjEvent;
  ISynchStateController *pssc;
  
  local_38 = (long *)0x0;
  pobjEvent = (IPalObject *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x18c);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033fede;
  uVar1 = (**(code **)(*g_pObjectManager + 0x28))
                    (g_pObjectManager,pthr,hEvent,&aotEvent,0,&local_38);
  if (uVar1 == 0) {
    uVar1 = (**(code **)(*local_38 + 0x28))(local_38,pthr,&pobjEvent);
    if (uVar1 == 0) {
      uVar1 = (*pobjEvent->_vptr_IPalObject[1])(pobjEvent,(ulong)(fSetEvent != 0));
      if (uVar1 == 0) {
        uVar1 = 0;
        goto LAB_0033fea1;
      }
      fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
              ,0x1b1);
      __format = "Error %d setting event state\n";
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalSetEvent",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
              ,0x1a9);
      __format = "Error %d obtaining synch state controller\n";
    }
    fprintf(_stderr,__format,(ulong)uVar1);
  }
  else if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033fede;
LAB_0033fea1:
  if (pobjEvent != (IPalObject *)0x0) {
    (*pobjEvent->_vptr_IPalObject[6])();
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x40))(local_38,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_0033fede:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalSetEvent(
    CPalThread *pthr,
    HANDLE hEvent,
    BOOL fSetEvent
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalSetEvent(pthr=%p, hEvent=%p, fSetEvent=%i\n",
        pthr,
        hEvent,
        fSetEvent
        );

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hEvent,
        &aotEvent,
        0, // Should be EVENT_MODIFY_STATE; currently ignored (no Win32 security)
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hEvent, palError);
        goto InternalSetEventExit;
    }

    palError = pobjEvent->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalSetEventExit;
    }

    palError = pssc->SetSignalCount(fSetEvent ? 1 : 0);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d setting event state\n", palError);
        goto InternalSetEventExit;
    }

InternalSetEventExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalSetEvent returns %d\n", palError);

    return palError;
}